

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegExpConstructor.cpp
# Opt level: O2

BOOL __thiscall
Js::JavascriptRegExpConstructor::IsConfigurable
          (JavascriptRegExpConstructor *this,PropertyId propertyId)

{
  BOOL BVar1;
  
  if ((propertyId - 0x1d0U < 0x17) && ((0x78ffffU >> (propertyId - 0x1d0U & 0x1f) & 1) != 0)) {
    return 0;
  }
  BVar1 = JavascriptFunction::IsConfigurable((JavascriptFunction *)this,propertyId);
  return BVar1;
}

Assistant:

BOOL JavascriptRegExpConstructor::IsConfigurable(PropertyId propertyId)
    {
        switch (propertyId)
        {
        case PropertyIds::input:
        case PropertyIds::$_:

        case PropertyIds::lastMatch:
        case PropertyIds::$Ampersand:

        case PropertyIds::lastParen:
        case PropertyIds::$Plus:

        case PropertyIds::leftContext:
        case PropertyIds::$BackTick:

        case PropertyIds::rightContext:
        case PropertyIds::$Tick:

        case PropertyIds::$1:
        case PropertyIds::$2:
        case PropertyIds::$3:
        case PropertyIds::$4:
        case PropertyIds::$5:
        case PropertyIds::$6:
        case PropertyIds::$7:
        case PropertyIds::$8:
        case PropertyIds::$9:
        case PropertyIds::index:
            return false;
        default:
            return JavascriptFunction::IsConfigurable(propertyId);
        }
    }